

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O1

type_conflict2
jsoncons::detail::from_integer<unsigned_long,jsoncons::string_sink<std::__cxx11::wstring>>
          (unsigned_long value,
          string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *result)

{
  bool bVar1;
  ulong uVar2;
  assertion_error *this;
  ulong uVar3;
  type_conflict2 tVar4;
  uint *puVar5;
  char_type buf [255];
  string local_448;
  uint local_428 [258];
  
  tVar4 = 0;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    *(uint *)((long)local_428 + uVar3) = (int)value + (int)(value / 10) * -10 | 0x30;
    tVar4 = tVar4 + 1;
    if (0x3f7 < uVar3) break;
    bVar1 = 9 < value;
    uVar2 = uVar3 + 4;
    value = value / 10;
  } while (bVar1);
  if (uVar3 + 4 != 0x3fc) {
    for (puVar5 = (uint *)((long)local_428 + uVar3); local_428 <= puVar5; puVar5 = puVar5 + -1) {
      std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
    }
    return tVar4;
  }
  this = (assertion_error *)__cxa_allocate_exception(0x10);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_448,"assertion \'p != last\' failed at  <> :0","");
  assertion_error::assertion_error(this,&local_448);
  __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }